

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O0

bool __thiscall IntVar::remVal(IntVar *this,int64_t v,Reason param_3,bool param_4)

{
  FILE *__stream;
  byte o;
  bool bVar1;
  char *pcVar2;
  byte in_CL;
  Tchar *in_RSI;
  long in_RDI;
  IntVar *in_stack_ffffffffffffffc0;
  bool local_1;
  
  o = in_CL & 1;
  bVar1 = isFixed(in_stack_ffffffffffffffc0);
  __stream = _stderr;
  if (bVar1) {
    local_1 = false;
  }
  else if (*(long *)(in_RDI + 0x28) == 0) {
    if ((engine.finished_init & 1U) == 0) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/vars/int-var.cpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/vars/int-var.cpp"
        ;
      }
      else {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/vars/int-var.cpp"
                         ,0x2f);
        pcVar2 = pcVar2 + 1;
      }
      fprintf(__stream,"%s:%d: ",pcVar2,0x1ba);
      fprintf(_stderr,"Assertion failed.\n");
      abort();
    }
    local_1 = true;
  }
  else {
    Tchar::operator=(in_RSI,o);
    *(uint *)(in_RDI + 0x40) = *(uint *)(in_RDI + 0x40) | 1;
    updateMin(in_stack_ffffffffffffffc0);
    updateMax(in_stack_ffffffffffffffc0);
    updateFixed(in_stack_ffffffffffffffc0);
    pushInQueue(in_stack_ffffffffffffffc0);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool IntVar::remVal(int64_t v, Reason /*r*/, bool /*channel*/) {
	assert(remValNotR(v));
	if (isFixed()) {
		return false;
	}
	if (vals == nullptr) {
		if (!engine.finished_init) {
			NEVER;
		}
		return true;
	}
#if INT_DOMAIN_LIST
	if (v == min) {
		min = vals_list[2 * min + 1];
		changes |= EVENT_C | EVENT_L;
	} else if (v == max) {
		max = vals_list[2 * max];
		changes |= EVENT_C | EVENT_U;
	} else {
		vals[v] = 0;
		vals_list[vals_list[2 * v] * 2 + 1] = vals_list[2 * v + 1];
		vals_list[vals_list[2 * v + 1] * 2] = vals_list[2 * v];
		changes |= EVENT_C;
	}
	--vals_count;
#else
	vals[v] = 0;
	changes |= EVENT_C;
	updateMin();
	updateMax();
#endif
	updateFixed();
	pushInQueue();
	return true;
}